

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O0

void Mio_LibraryReadProfile(FILE *pFile,Mio_Library_t *pLib)

{
  undefined8 pGate_00;
  int Prof;
  char *pcVar1;
  char *pcVar2;
  char *pToken;
  char pBuffer [1000];
  Mio_Gate_t *pGate;
  Mio_Library_t *pLib_local;
  FILE *pFile_local;
  
  while (pcVar1 = fgets((char *)&pToken,1000,(FILE *)pFile), pcVar1 != (char *)0x0) {
    pcVar1 = strtok((char *)&pToken," \t\n");
    if ((pcVar1 != (char *)0x0) && (*pcVar1 != '#')) {
      pBuffer._992_8_ = Mio_LibraryReadGateByName(pLib,pcVar1,(char *)0x0);
      if ((Mio_Gate_t *)pBuffer._992_8_ == (Mio_Gate_t *)0x0) {
        pcVar2 = Mio_LibraryReadName(pLib);
        printf("Cannot find gate \"%s\" in library \"%s\".\n",pcVar1,pcVar2);
      }
      else {
        pcVar1 = strtok((char *)0x0," \t\n");
        pGate_00 = pBuffer._992_8_;
        Prof = atoi(pcVar1);
        Mio_GateSetProfile((Mio_Gate_t *)pGate_00,Prof);
      }
    }
  }
  return;
}

Assistant:

void Mio_LibraryReadProfile( FILE * pFile, Mio_Library_t * pLib )
{
    Mio_Gate_t * pGate;    
    char pBuffer[1000];
    while ( fgets( pBuffer, 1000, pFile ) != NULL )
    {
        char * pToken = strtok( pBuffer, " \t\n" );
        if ( pToken == NULL )
            continue;
        if ( pToken[0] == '#' )
            continue;
        // read gate
        pGate = Mio_LibraryReadGateByName( pLib, pToken, NULL );
        if ( pGate == NULL )
        {
            printf( "Cannot find gate \"%s\" in library \"%s\".\n", pToken, Mio_LibraryReadName(pLib) );
            continue;
        }
        // read profile
        pToken = strtok( NULL, " \t\n" );
        Mio_GateSetProfile( pGate, atoi(pToken) );
    }
}